

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this)

{
  pointer pLVar1;
  long lVar2;
  long lVar3;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
  if (lVar3 == 0) {
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,(lVar3 >> 3) * -0x5555555555555555);
  }
  else {
    if (*(int *)((long)pLVar1 + lVar3 + -0x18) == 7) {
      if ((ulong)((lVar3 >> 3) * -0x5555555555555555) < 2) {
        PrintError(this,"accessing stack depth: %u >= max: %zd",1);
        return (Result)Error;
      }
      *(undefined4 *)((long)pLVar1 + lVar3 + -0x18) = 8;
      lVar2 = *(long *)((long)pLVar1 + lVar3 + -0x28);
      if (*(long *)(lVar2 + 0x10) != 0) {
        lVar2 = *(long *)(lVar2 + 8);
        if (*(int *)(lVar2 + 0x38) == 0x2e) {
          *(long *)((long)pLVar1 + lVar3 + -0x10) = lVar2 + 0x118;
          return (Result)Ok;
        }
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                      ,0x4e,
                      "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]");
      }
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                    ,0x192,
                    "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                   );
    }
    PrintError(this,"catch expression without matching try");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr() {
  LabelNode* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->label_type != LabelType::Try) {
    PrintError("catch expression without matching try");
    return Result::Error;
  }

  LabelNode* parent_label;
  CHECK_RESULT(GetLabelAt(&parent_label, 1));

  label->label_type = LabelType::Catch;
  label->exprs = &cast<TryExpr>(&parent_label->exprs->back())->catch_;
  return Result::Ok;
}